

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2scan_x.hpp
# Opt level: O1

void ExchCXX::kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double __x;
  double dVar8;
  double dVar9;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 uStack_104;
  undefined8 uStack_100;
  
  dVar27 = 1.0 / (rho_a + rho_b);
  dVar4 = cbrt(1e-15);
  dVar5 = cbrt(rho_a + rho_b);
  dVar6 = cbrt(rho_a);
  dVar7 = cbrt(rho_b);
  dVar28 = (rho_a - rho_b) * dVar27;
  lVar2 = -(ulong)(dVar27 * (rho_a + rho_a) <= 1e-15);
  lVar3 = -(ulong)(dVar27 * (rho_b + rho_b) <= 1e-15);
  auVar15._8_8_ = lVar3;
  auVar15._0_8_ = lVar2;
  auVar19._8_8_ = 1.0 - dVar28;
  auVar19._0_8_ = dVar28 + 1.0;
  auVar29._8_4_ = (int)lVar2;
  auVar29._0_8_ = lVar3;
  auVar29._12_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar15 = auVar15 & _DAT_0103b540 | ~auVar15 & (auVar29 & _DAT_0103b530 | ~auVar29 & auVar19);
  __x = auVar15._0_8_;
  dVar28 = cbrt(__x);
  uStack_104 = auVar15._4_4_;
  uStack_100._0_4_ = auVar15._8_4_;
  dVar8 = cbrt((double)CONCAT44(uStack_104,(undefined4)uStack_100));
  dVar27 = rho_a * rho_a;
  dVar9 = exp((((1.0 / dVar6) / (dVar27 * dVar27 * rho_a)) * sigma_aa * sigma_aa *
               -0.1559676420330081 * 58.88045974722155) / 576.0);
  dVar30 = rho_b * rho_b;
  auVar22._0_8_ = dVar6 * dVar6 * dVar27;
  auVar22._8_8_ = dVar30 * dVar7 * dVar7;
  auVar22 = divpd(_DAT_0103b460,auVar22);
  auVar16._8_8_ = dVar7 * dVar7 * rho_b;
  auVar16._0_8_ = dVar6 * dVar6 * rho_a;
  auVar16 = divpd(_DAT_0103b460,auVar16);
  dVar26 = auVar22._0_8_;
  dVar12 = auVar22._8_8_;
  auVar17._0_8_ = sigma_aa * 0.001 * dVar26 * 0.125 + 4.557799872345597;
  auVar17._8_8_ = sigma_bb * 0.001 * dVar12 * 0.125 + 4.557799872345597;
  auVar22 = divpd(_DAT_0103b460,auVar17);
  dVar18 = auVar22._0_8_ * (sigma_aa * dVar26 * -0.125 + auVar16._0_8_ * tau_a);
  dVar20 = auVar22._8_8_ * (sigma_bb * dVar12 * -0.125 + auVar16._8_8_ * tau_b);
  dVar27 = 0.0;
  if (dVar18 <= 0.0) {
    dVar27 = dVar18;
  }
  dVar27 = exp(dVar27 * -0.667 * (1.0 / (1.0 - dVar27)));
  dVar10 = exp((double)(~-(ulong)(2.5 < dVar18) & 0xbfe1111111111111 |
                       (ulong)(0.8 / (1.0 - dVar18)) & -(ulong)(2.5 < dVar18)));
  auVar1._8_8_ = dVar20;
  auVar1._0_8_ = dVar18;
  auVar16 = minpd(_DAT_0103c080,auVar1);
  if (sigma_aa < 0.0) {
    dVar11 = sqrt(sigma_aa);
  }
  else {
    dVar11 = SQRT(sigma_aa);
  }
  uStack_100 = auVar15._8_8_;
  local_118 = auVar16._0_8_;
  uStack_110 = auVar16._8_8_;
  dVar21 = local_118 * local_118;
  dVar25 = uStack_110 * uStack_110;
  dVar6 = (1.0 / (dVar6 * rho_a)) * dVar11 * 1.5393389262365065;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar11 = exp(-17.140028381540095 / dVar6);
  dVar6 = exp((((1.0 / dVar7) / (dVar30 * dVar30 * rho_b)) * sigma_bb * sigma_bb *
               -0.1559676420330081 * 58.88045974722155) / 576.0);
  auVar23._0_8_ =
       dVar26 * (dVar9 * -0.12082102608751867 + 0.12345679012345678) * 1.8171205928321397 *
                sigma_aa * 0.21733691746289932;
  auVar23._8_8_ =
       dVar12 * sigma_bb * 0.21733691746289932 *
                (dVar6 * -0.12082102608751867 + 0.12345679012345678) * 1.8171205928321397;
  auVar16 = divpd(auVar23,_DAT_0103b570);
  auVar24._0_8_ = auVar16._0_8_ + (double)DAT_0103bf00;
  auVar24._8_8_ = auVar16._8_8_ + DAT_0103bf00._8_8_;
  auVar16 = divpd(_DAT_0103bf00,auVar24);
  dVar9 = (1.0 - auVar16._0_8_) * (double)DAT_0103bf00;
  dVar26 = (1.0 - auVar16._8_8_) * DAT_0103bf00._8_8_;
  dVar6 = 0.0;
  if (dVar20 <= 0.0) {
    dVar6 = dVar20;
  }
  dVar6 = exp(dVar6 * -0.667 * (1.0 / (1.0 - dVar6)));
  dVar12 = dVar21 * dVar21;
  dVar30 = dVar25 * dVar25;
  if (2.5 < dVar18) {
    dVar13 = 0.8 / (1.0 - dVar20);
  }
  else {
    dVar13 = -0.5333333333333333;
  }
  dVar13 = exp(dVar13);
  if (sigma_bb < 0.0) {
    dVar14 = sqrt(sigma_bb);
  }
  else {
    dVar14 = SQRT(sigma_bb);
  }
  dVar7 = (1.0 / (dVar7 * rho_b)) * dVar14 * 1.5393389262365065;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar7 = exp(-17.140028381540095 / dVar7);
  *eps = (double)(-(ulong)(1e-11 < rho_b) &
                 (ulong)((double)((ulong)(dVar4 * 1e-15) & -(ulong)(uStack_100 <= 1e-15) |
                                 ~-(ulong)(uStack_100 <= 1e-15) & (ulong)(dVar8 * uStack_100)) *
                         0.9847450218426964 * -0.375 *
                        (1.0 - dVar7) *
                        dVar5 * ((0.174 - dVar26) *
                                 (double)(~-(ulong)(dVar20 <= 0.0) &
                                          (~-(ulong)(dVar20 <= 2.5) & (ulong)(dVar13 * -1.24) |
                                          (ulong)(dVar30 * -0.023185843322 * uStack_110 * dVar25 +
                                                 dVar25 * dVar30 * 0.234528941479 +
                                                 uStack_110 * dVar30 * -0.887998041597 +
                                                 dVar30 * 1.45129704449 +
                                                 uStack_110 * dVar25 * -0.663086601049 +
                                                 dVar25 * -0.4445555 + uStack_110 * -0.667 + 1.0) &
                                          -(ulong)(dVar20 <= 2.5)) |
                                         (ulong)dVar6 & -(ulong)(dVar20 <= 0.0)) + dVar26 + 1.0))) +
         (double)(-(ulong)(1e-11 < rho_a) &
                 (ulong)((double)((ulong)(dVar4 * 1e-15) & -(ulong)(__x <= 1e-15) |
                                 ~-(ulong)(__x <= 1e-15) & (ulong)(dVar28 * __x)) *
                         0.9847450218426964 * -0.375 *
                        (1.0 - dVar11) *
                        dVar5 * ((0.174 - dVar9) *
                                 (double)(~-(ulong)(dVar18 <= 0.0) &
                                          (~-(ulong)(dVar18 <= 2.5) & (ulong)(dVar10 * -1.24) |
                                          (ulong)(dVar12 * -0.023185843322 * local_118 * dVar21 +
                                                 dVar21 * dVar12 * 0.234528941479 +
                                                 local_118 * dVar12 * -0.887998041597 +
                                                 dVar12 * 1.45129704449 +
                                                 local_118 * dVar21 * -0.663086601049 +
                                                 dVar21 * -0.4445555 + local_118 * -0.667 + 1.0) &
                                          -(ulong)(dVar18 <= 2.5)) |
                                         (ulong)dVar27 & -(ulong)(dVar18 <= 0.0)) + dVar9 + 1.0)));
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double lapl_a, double lapl_b, double tau_a, double tau_b, double& eps ) {

    (void)(sigma_ab);
    (void)(lapl_a);
    (void)(lapl_b);
    (void)(eps);
    constexpr double t3 = constants::m_cbrt_3;
    constexpr double t4 = constants::m_cbrt_pi;
    constexpr double t31 = constants::m_cbrt_6;
    constexpr double t33 = constants::m_pi_sq;
    constexpr double t34 = constants::m_cbrt_pi_sq;
    constexpr double t6 = t3 / t4;
    constexpr double t30 = 0.2e2 / 0.27e2 + 0.5e1 / 0.3e1 * eta;
    constexpr double t32 = t31 * t31;
    constexpr double t35 = t34 * t33;
    constexpr double t36 = 0.1e1 / t35;
    constexpr double t37 = t32 * t36;
    constexpr double t46 = dp2 * dp2;
    constexpr double t47 = t46 * t46;
    constexpr double t48 = 0.1e1 / t47;
    constexpr double t57 = t34 * t34;
    constexpr double t58 = 0.1e1 / t57;
    constexpr double t78 = 0.3e1 / 0.1e2 * t32 * t57;
    constexpr double t122 = 0.1e1 / t34;
    constexpr double t123 = t32 * t122;


    const double t2 = rho_a <= dens_tol;
    const double t7 = rho_a + rho_b;
    const double t8 = 0.1e1 / t7;
    const double t11 = 0.2e1 * rho_a * t8 <= zeta_tol;
    const double t12 = zeta_tol - 0.1e1;
    const double t15 = 0.2e1 * rho_b * t8 <= zeta_tol;
    const double t16 = -t12;
    const double t17 = rho_a - rho_b;
    const double t19 = piecewise_functor_5( t11, t12, t15, t16, t17 * t8 );
    const double t20 = 0.1e1 + t19;
    const double t21 = t20 <= zeta_tol;
    const double t22 = safe_math::cbrt( zeta_tol );
    const double t23 = t22 * zeta_tol;
    const double t24 = safe_math::cbrt( t20 );
    const double t26 = piecewise_functor_3( t21, t23, t24 * t20 );
    const double t27 = t6 * t26;
    const double t28 = safe_math::cbrt( t7 );
    const double t38 = sigma_aa * sigma_aa;
    const double t39 = rho_a * rho_a;
    const double t40 = t39 * t39;
    const double t41 = t40 * rho_a;
    const double t42 = safe_math::cbrt( rho_a );
    const double t44 = 0.1e1 / t42 / t41;
    const double t45 = t38 * t44;
    const double t52 = safe_math::exp( -t37 * t45 * t48 / 0.576e3 );
    const double t56 = ( -0.162742215233874e0 * t30 * t52 + 0.1e2 / 0.81e2 ) * t31;
    const double t59 = t58 * sigma_aa;
    const double t60 = t42 * t42;
    const double t61 = t60 * t39;
    const double t62 = 0.1e1 / t61;
    const double t66 = k1 + t56 * t59 * t62 / 0.24e2;
    const double t70 = k1 * ( 0.1e1 - k1 / t66 );
    const double t71 = t60 * rho_a;
    const double t72 = 0.1e1 / t71;
    const double t74 = sigma_aa * t62;
    const double t76 = tau_a * t72 - t74 / 0.8e1;
    const double t79 = eta * sigma_aa;
    const double t82 = t78 + t79 * t62 / 0.8e1;
    const double t83 = 0.1e1 / t82;
    const double t84 = t76 * t83;
    const double t85 = t84 <= 0.e0;
    const double t86 = 0.e0 < t84;
    const double t87 = piecewise_functor_3( t86, 0.0, t84 );
    const double t88 = c1 * t87;
    const double t89 = 0.1e1 - t87;
    const double t90 = 0.1e1 / t89;
    const double t92 = safe_math::exp( -t88 * t90 );
    const double t93 = t84 <= 0.25e1;
    const double t94 = 0.25e1 < t84;
    const double t95 = piecewise_functor_3( t94, 0.25e1, t84 );
    const double t97 = t95 * t95;
    const double t99 = t97 * t95;
    const double t101 = t97 * t97;
    const double t103 = t101 * t95;
    const double t105 = t101 * t97;
    const double t110 = piecewise_functor_3( t94, t84, 0.25e1 );
    const double t111 = 0.1e1 - t110;
    const double t114 = safe_math::exp( c2 / t111 );
    const double t116 = piecewise_functor_5( t85, t92, t93, 0.1e1 - 0.667e0 * t95 - 0.4445555e0 * t97 - 0.663086601049e0 * t99 + 0.145129704449e1 * t101 - 0.887998041597e0 * t103 + 0.234528941479e0 * t105 - 0.23185843322e-1 * t101 * t99, -d * t114 );
    const double t117 = 0.174e0 - t70;
    const double t119 = t116 * t117 + t70 + 0.1e1;
    const double t120 = t28 * t119;
    const double t121 = safe_math::sqrt( 0.3e1 );
    const double t124 = safe_math::sqrt( sigma_aa );
    const double t125 = t42 * rho_a;
    const double t126 = 0.1e1 / t125;
    const double t128 = t123 * t124 * t126;
    const double t129 = safe_math::sqrt( t128 );
    const double t133 = safe_math::exp( -0.98958e1 * t121 / t129 );
    const double t134 = 0.1e1 - t133;
    const double t135 = t120 * t134;
    const double t138 = piecewise_functor_3( t2, 0.0, -0.3e1 / 0.8e1 * t27 * t135 );
    const double t139 = rho_b <= dens_tol;
    const double t140 = -t17;
    const double t142 = piecewise_functor_5( t15, t12, t11, t16, t140 * t8 );
    const double t143 = 0.1e1 + t142;
    const double t144 = t143 <= zeta_tol;
    const double t145 = safe_math::cbrt( t143 );
    const double t147 = piecewise_functor_3( t144, t23, t145 * t143 );
    const double t148 = t6 * t147;
    const double t149 = sigma_bb * sigma_bb;
    const double t150 = rho_b * rho_b;
    const double t151 = t150 * t150;
    const double t152 = t151 * rho_b;
    const double t153 = safe_math::cbrt( rho_b );
    const double t155 = 0.1e1 / t153 / t152;
    const double t156 = t149 * t155;
    const double t160 = safe_math::exp( -t37 * t156 * t48 / 0.576e3 );
    const double t164 = ( -0.162742215233874e0 * t30 * t160 + 0.1e2 / 0.81e2 ) * t31;
    const double t165 = t58 * sigma_bb;
    const double t166 = t153 * t153;
    const double t167 = t166 * t150;
    const double t168 = 0.1e1 / t167;
    const double t172 = k1 + t164 * t165 * t168 / 0.24e2;
    const double t176 = k1 * ( 0.1e1 - k1 / t172 );
    const double t177 = t166 * rho_b;
    const double t178 = 0.1e1 / t177;
    const double t180 = sigma_bb * t168;
    const double t182 = tau_b * t178 - t180 / 0.8e1;
    const double t183 = eta * sigma_bb;
    const double t186 = t78 + t183 * t168 / 0.8e1;
    const double t187 = 0.1e1 / t186;
    const double t188 = t182 * t187;
    const double t189 = t188 <= 0.e0;
    const double t190 = 0.e0 < t188;
    const double t191 = piecewise_functor_3( t190, 0.0, t188 );
    const double t192 = c1 * t191;
    const double t193 = 0.1e1 - t191;
    const double t194 = 0.1e1 / t193;
    const double t196 = safe_math::exp( -t192 * t194 );
    const double t197 = t188 <= 0.25e1;
    const double t198 = 0.25e1 < t188;
    const double t199 = piecewise_functor_3( t198, 0.25e1, t188 );
    const double t201 = t199 * t199;
    const double t203 = t201 * t199;
    const double t205 = t201 * t201;
    const double t207 = t205 * t199;
    const double t209 = t205 * t201;
    const double t214 = piecewise_functor_3( t198, t188, 0.25e1 );
    const double t215 = 0.1e1 - t214;
    const double t218 = safe_math::exp( c2 / t215 );
    const double t220 = piecewise_functor_5( t189, t196, t197, 0.1e1 - 0.667e0 * t199 - 0.4445555e0 * t201 - 0.663086601049e0 * t203 + 0.145129704449e1 * t205 - 0.887998041597e0 * t207 + 0.234528941479e0 * t209 - 0.23185843322e-1 * t205 * t203, -d * t218 );
    const double t221 = 0.174e0 - t176;
    const double t223 = t220 * t221 + t176 + 0.1e1;
    const double t224 = t28 * t223;
    const double t225 = safe_math::sqrt( sigma_bb );
    const double t226 = t153 * rho_b;
    const double t227 = 0.1e1 / t226;
    const double t229 = t123 * t225 * t227;
    const double t230 = safe_math::sqrt( t229 );
    const double t234 = safe_math::exp( -0.98958e1 * t121 / t230 );
    const double t235 = 0.1e1 - t234;
    const double t236 = t224 * t235;
    const double t239 = piecewise_functor_3( t139, 0.0, -0.3e1 / 0.8e1 * t148 * t236 );


    eps = t138 + t239;

  }